

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

void client_configure_window_rect
               (xcb_connection_t *connection,xcb_window_t window,xcb_rectangle_t rect,
               uint32_t border_width)

{
  uint32_t values [5];
  
  xcb_configure_window(connection,window,0x1f);
  xcb_flush(connection);
  return;
}

Assistant:

void client_configure_window_rect(xcb_connection_t *connection, xcb_window_t window,
                                  xcb_rectangle_t rect, uint32_t border_width)
{
        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y | XCB_CONFIG_WINDOW_WIDTH
                | XCB_CONFIG_WINDOW_HEIGHT | XCB_CONFIG_WINDOW_BORDER_WIDTH;
        uint32_t values[] = {
                (uint16_t)rect.x,
                (uint16_t)rect.y,
                rect.width,
                rect.height,
                border_width,
        };

        xcb_configure_window(connection, window, mask, values);

        xcb_flush(connection);
}